

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall boost::runtime::cla::parser::build_trie(parser *this,parameters_store *parameters)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  element_type *peVar3;
  shared_count sVar4;
  parameter_trie *__tmp;
  mapped_type *pmVar5;
  parameter_trie *p;
  element_type *peVar6;
  _Rb_tree_header *p_Var7;
  char *__function;
  ulong uVar8;
  parameter_cla_id *ppVar9;
  basic_param_ptr param;
  element_type *local_b8;
  shared_count sStack_b0;
  key_type local_a8;
  element_type *local_98;
  shared_count asStack_90 [2];
  _Base_ptr local_80;
  element_type *local_78;
  shared_count local_70;
  basic_param_ptr local_68;
  element_type *local_58;
  element_type *local_50;
  shared_count local_48;
  key_type local_40;
  
  peVar6 = (element_type *)
           (parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = (element_type *)&(parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  if (peVar6 != local_58) {
    local_80 = (_Base_ptr)&this->m_param_trie;
    do {
      local_78 = (element_type *)(peVar6->p_description)._M_string_length;
      local_70.pi_ = (sp_counted_base *)(peVar6->p_description).field_2._M_allocated_capacity;
      if (local_70.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
        UNLOCK();
      }
      if (local_78 == (element_type *)0x0) {
LAB_00197a4e:
        __function = 
        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
        ;
LAB_00197a44:
        __assert_fail("px != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                      ,0x2de,__function);
      }
      ppVar9 = (local_78->m_cla_ids).
               super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48.pi_ = (sp_counted_base *)
                     (local_78->m_cla_ids).
                     super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = peVar6;
      if (ppVar9 != (parameter_cla_id *)local_48.pi_) {
        do {
          local_a8.m_begin = (ppVar9->m_prefix)._M_dataplus._M_p;
          local_a8.m_end =
               (iterator)
               ((long)&(((element_type *)local_a8.m_begin)->m_subtrie)._M_t._M_impl.field_0x0 +
               (ppVar9->m_prefix)._M_string_length);
          pmVar5 = std::
                   map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                   ::operator[]((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                                 *)local_80,&local_a8);
          peVar1 = pmVar5->px;
          sStack_b0.pi_ = (pmVar5->pn).pi_;
          if (sStack_b0.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (sStack_b0.pi_)->use_count_ = (sStack_b0.pi_)->use_count_ + 1;
            UNLOCK();
          }
          local_b8 = peVar1;
          if (peVar1 == (element_type *)0x0) {
            p = (parameter_trie *)operator_new(0x60);
            p_Var7 = &(p->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
            (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header
            ;
            (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var7->_M_header;
            (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (p->m_id_candidates).
            super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (p->m_id_candidates).
            super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (p->m_id_candidates).
            super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (p->m_param_candidate).px = (element_type *)0x0;
            (p->m_param_candidate).pn.pi_ = (sp_counted_base *)0x0;
            p->m_has_final_candidate = false;
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
                      ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)&local_98,p
                      );
            local_40.m_begin = (ppVar9->m_prefix)._M_dataplus._M_p;
            local_40.m_end = local_40.m_begin + (ppVar9->m_prefix)._M_string_length;
            pmVar5 = std::
                     map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                     ::operator[]((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                                   *)local_80,&local_40);
            sVar4.pi_ = asStack_90[0].pi_;
            peVar3 = local_98;
            local_98 = (element_type *)0x0;
            asStack_90[0].pi_ = (sp_counted_base *)0x0;
            local_a8.m_begin = (iterator)pmVar5->px;
            local_a8.m_end = (iterator)(pmVar5->pn).pi_;
            pmVar5->px = peVar3;
            (pmVar5->pn).pi_ = sVar4.pi_;
            detail::shared_count::~shared_count((shared_count *)&local_a8.m_end);
            local_b8 = pmVar5->px;
            psVar2 = (pmVar5->pn).pi_;
            if (psVar2 != (sp_counted_base *)0x0) {
              LOCK();
              psVar2->use_count_ = psVar2->use_count_ + 1;
              UNLOCK();
            }
            local_a8.m_end = (iterator)sStack_b0.pi_;
            sStack_b0.pi_ = psVar2;
            local_a8.m_begin = (iterator)peVar1;
            detail::shared_count::~shared_count((shared_count *)&local_a8.m_end);
            detail::shared_count::~shared_count(asStack_90);
          }
          if ((ppVar9->m_tag)._M_string_length != 0) {
            uVar8 = 0;
            do {
              peVar1 = local_b8;
              if (local_b8 == (element_type *)0x0) {
LAB_00197a2f:
                __function = 
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->() const [T = boost::runtime::cla::rt_cla_detail::parameter_trie]"
                ;
                goto LAB_00197a44;
              }
              rt_cla_detail::parameter_trie::make_subtrie
                        ((parameter_trie *)&local_98,(char)local_b8);
              sVar4.pi_ = asStack_90[0].pi_;
              local_b8 = local_98;
              local_a8.m_end = (iterator)sStack_b0.pi_;
              local_98 = (element_type *)0x0;
              asStack_90[0].pi_ = (sp_counted_base *)0x0;
              sStack_b0.pi_ = sVar4.pi_;
              local_a8.m_begin = (iterator)peVar1;
              detail::shared_count::~shared_count((shared_count *)&local_a8.m_end);
              detail::shared_count::~shared_count(asStack_90);
              if (local_b8 == (parameter_trie *)0x0) goto LAB_00197a2f;
              local_68.px = local_78;
              local_68.pn.pi_ = local_70.pi_;
              if (local_70.pi_ != (sp_counted_base *)0x0) {
                LOCK();
                (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
                UNLOCK();
              }
              rt_cla_detail::parameter_trie::add_candidate_id
                        (local_b8,ppVar9,&local_68,uVar8 == (ppVar9->m_tag)._M_string_length - 1);
              detail::shared_count::~shared_count(&local_68.pn);
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ppVar9->m_tag)._M_string_length);
          }
          detail::shared_count::~shared_count(&sStack_b0);
          if (local_78 == (element_type *)0x0) goto LAB_00197a4e;
          ppVar9 = ppVar9 + 1;
        } while (ppVar9 != (parameter_cla_id *)local_48.pi_);
      }
      detail::shared_count::~shared_count(&local_70);
      peVar6 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_50);
    } while (peVar6 != local_58);
  }
  return;
}

Assistant:

BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, parameters.all() ) {
            basic_param_ptr param = v.second;

            // Register all parameter's ids in trie.
            BOOST_TEST_FOREACH( parameter_cla_id const&, id, param->cla_ids() ) {
                // This is the trie corresponding to the prefix.
                trie_ptr next_trie = m_param_trie[id.m_prefix];
                if( !next_trie )
                    next_trie = m_param_trie[id.m_prefix] = trie_ptr( new rt_cla_detail::parameter_trie );

                // Build the trie, by following name's characters
                // and register this parameter as candidate on each level
                for( size_t index = 0; index < id.m_tag.size(); ++index ) {
                    next_trie = next_trie->make_subtrie( id.m_tag[index] );

                    next_trie->add_candidate_id( id, param, index == (id.m_tag.size() - 1) );
                }
            }
        }